

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O1

void printopaquemem(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_mode cVar2;
  cs_detail *pcVar3;
  _Bool _Var4;
  uint8_t uVar5;
  uint uVar6;
  MCOperand *pMVar7;
  MCOperand *op;
  MCOperand *op_00;
  MCOperand *op_01;
  ulong uVar8;
  int64_t iVar9;
  char *fmt;
  
  cVar2 = MI->csh->mode;
  if (cVar2 == CS_MODE_16) {
    uVar5 = '\x02';
LAB_001aba6a:
    MI->x86opsize = uVar5;
    printMemReference(MI,OpNo,O);
    return;
  }
  if (cVar2 == CS_MODE_64) {
    uVar5 = '\b';
    goto LAB_001aba6a;
  }
  if (cVar2 == CS_MODE_32) {
    uVar5 = '\x04';
    goto LAB_001aba6a;
  }
  pMVar7 = MCInst_getOperand(MI,OpNo);
  op = MCInst_getOperand(MI,OpNo + 2);
  op_00 = MCInst_getOperand(MI,OpNo + 3);
  op_01 = MCInst_getOperand(MI,OpNo + 4);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x3e;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    pcVar3->groups[(ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x5e] = MI->x86opsize;
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x46;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar6 = MCOperand_getReg(pMVar7);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x4a) = uVar6;
    uVar6 = MCOperand_getReg(op);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x4e) = uVar6;
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x52;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x56;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
  }
  uVar6 = MCOperand_getReg(op_01);
  if (uVar6 != 0) {
    _printOperand(MI,OpNo + 4,O);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar3 = MI->flat_insn->detail;
      *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x46) =
           uVar6;
    }
    SStream_concat0(O,":");
  }
  _Var4 = MCOperand_isImm(op_00);
  if (!_Var4) goto LAB_001ab845;
  uVar8 = MCOperand_getImm(op_00);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    *(ulong *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x56) = uVar8
    ;
  }
  if (uVar8 == 0) goto LAB_001ab845;
  uVar6 = MCOperand_getReg(op);
  if ((uVar6 == 0) && (uVar6 = MCOperand_getReg(pMVar7), uVar6 == 0)) {
    if ((long)uVar8 < 0) {
      uVar8 = arch_masks[MI->csh->mode] & uVar8;
      fmt = "0x%lx";
    }
    else {
LAB_001ab7d6:
      if ((long)uVar8 < 10) {
        fmt = "%lu";
      }
      else {
        fmt = "0x%lx";
      }
    }
  }
  else {
    if (-1 < (long)uVar8) goto LAB_001ab7d6;
    if ((long)uVar8 < -9) {
      fmt = "-0x%lx";
      uVar8 = -uVar8;
    }
    else {
      fmt = "-%lu";
      uVar8 = -uVar8;
    }
  }
  SStream_concat(O,fmt,uVar8);
LAB_001ab845:
  uVar6 = MCOperand_getReg(op);
  if ((uVar6 != 0) || (uVar6 = MCOperand_getReg(pMVar7), uVar6 != 0)) {
    SStream_concat0(O,"(");
    uVar6 = MCOperand_getReg(pMVar7);
    if (uVar6 != 0) {
      _printOperand(MI,OpNo,O);
    }
    uVar6 = MCOperand_getReg(op);
    if (uVar6 != 0) {
      SStream_concat0(O,", ");
      _printOperand(MI,OpNo + 2,O);
      pMVar7 = MCInst_getOperand(MI,OpNo + 1);
      iVar9 = MCOperand_getImm(pMVar7);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar3 = MI->flat_insn->detail;
        *(int *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x52) =
             (int)iVar9;
      }
      if (iVar9 != 1) {
        SStream_concat(O,", %u",iVar9);
      }
    }
    SStream_concat0(O,")");
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printopaquemem(MCInst *MI, unsigned OpNo, SStream *O)
{
	SStream_concat0(O, "ptr ");

	switch(MI->csh->mode) {
		case CS_MODE_16:
			if (MI->flat_insn->id == X86_INS_LJMP || MI->flat_insn->id == X86_INS_LCALL)
				MI->x86opsize = 4;
			else
				MI->x86opsize = 2;
			break;
		case CS_MODE_32:
			if (MI->flat_insn->id == X86_INS_LJMP || MI->flat_insn->id == X86_INS_LCALL)
				MI->x86opsize = 6;
			else
				MI->x86opsize = 4;
			break;
		case CS_MODE_64:
			if (MI->flat_insn->id == X86_INS_LJMP || MI->flat_insn->id == X86_INS_LCALL)
				MI->x86opsize = 10;
			else
				MI->x86opsize = 8;
			break;
		default:	// never reach
			break;
	}

	printMemReference(MI, OpNo, O);
}